

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O0

int ssl_read(BIO *bio,char *out,int outl)

{
  int iVar1;
  SSL *ssl_00;
  int ret;
  SSL *ssl;
  int outl_local;
  char *out_local;
  BIO *bio_local;
  
  ssl_00 = (SSL *)get_ssl(bio);
  if (ssl_00 == (SSL *)0x0) {
    bio_local._4_4_ = 0;
  }
  else {
    BIO_clear_retry_flags(bio);
    bio_local._4_4_ = SSL_read(ssl_00,out,outl);
    iVar1 = SSL_get_error(ssl_00,bio_local._4_4_);
    switch(iVar1) {
    case 0:
    case 1:
    case 5:
    case 6:
    default:
      break;
    case 2:
      BIO_set_retry_read(bio);
      break;
    case 3:
      BIO_set_retry_write(bio);
      break;
    case 7:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio,2);
      break;
    case 8:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio,3);
    }
  }
  return bio_local._4_4_;
}

Assistant:

static int ssl_read(BIO *bio, char *out, int outl) {
  SSL *ssl = get_ssl(bio);
  if (ssl == NULL) {
    return 0;
  }

  BIO_clear_retry_flags(bio);

  const int ret = SSL_read(ssl, out, outl);

  switch (SSL_get_error(ssl, ret)) {
    case SSL_ERROR_WANT_READ:
      BIO_set_retry_read(bio);
      break;

    case SSL_ERROR_WANT_WRITE:
      BIO_set_retry_write(bio);
      break;

    case SSL_ERROR_WANT_ACCEPT:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio, BIO_RR_ACCEPT);
      break;

    case SSL_ERROR_WANT_CONNECT:
      BIO_set_retry_special(bio);
      BIO_set_retry_reason(bio, BIO_RR_CONNECT);
      break;

    case SSL_ERROR_NONE:
    case SSL_ERROR_SYSCALL:
    case SSL_ERROR_SSL:
    case SSL_ERROR_ZERO_RETURN:
    default:
      break;
  }

  return ret;
}